

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotLine<float>
               (char *label_id,float *values,int count,double xscale,double x0,int offset,int stride
               )

{
  GetterYs<float> getter;
  GetterYs<float> local_28;
  
  if (count == 0) {
    local_28.Offset = 0;
  }
  else {
    local_28.Offset = (offset % count + count) % count;
  }
  local_28.Ys = values;
  local_28.Count = count;
  local_28.XScale = xscale;
  local_28.X0 = x0;
  local_28.Stride = stride;
  PlotLineEx<ImPlot::GetterYs<float>>(label_id,&local_28);
  return;
}

Assistant:

void PlotLine(const char* label_id, const T* values, int count, double xscale, double x0, int offset, int stride) {
    GetterYs<T> getter(values,count,xscale,x0,offset,stride);
    PlotLineEx(label_id, getter);
}